

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

size_t __thiscall
robin_hood::detail::
Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::findIdx<std::__cxx11::string>
          (Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  bool bVar1;
  DataNode<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  *in_RSI;
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  InfoType info;
  size_t idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  DataNode<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  *in_stack_ffffffffffffffb8;
  DataNode<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  InfoType local_24;
  size_t local_20;
  DataNode<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  *local_18;
  size_t local_8;
  
  local_20 = 0;
  local_24 = 0;
  local_18 = in_RSI;
  keyToIdx<std::__cxx11::string_const&>
            (in_RDI,in_stack_ffffffffffffffc8,(size_t *)in_stack_ffffffffffffffc0,
             (InfoType *)in_stack_ffffffffffffffb8);
  do {
    if (local_24 == in_RDI->mInfo[local_20]) {
      DataNode<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,false>
      ::getFirst<robin_hood::pair<std::__cxx11::string_const,std::pair<int,SeqEntry>>>
                ((DataNode<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,false>
                  *)(in_RDI->mKeyVals + local_20));
      bVar1 = std::
              equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x18f3ad);
      if (bVar1) {
        return local_20;
      }
    }
    Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::next(in_RDI,&local_24,&local_20);
    if (local_24 == in_RDI->mInfo[local_20]) {
      in_stack_ffffffffffffffc0 = local_18;
      DataNode<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,false>
      ::getFirst<robin_hood::pair<std::__cxx11::string_const,std::pair<int,SeqEntry>>>
                ((DataNode<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,false>
                  *)(in_RDI->mKeyVals + local_20));
      bVar1 = std::
              equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x18f426);
      if (bVar1) {
        return local_20;
      }
    }
    Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::next(in_RDI,&local_24,&local_20);
  } while (local_24 <= in_RDI->mInfo[local_20]);
  if (in_RDI->mMask == 0) {
    local_8 = 0;
  }
  else {
    reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,false>*>
              (in_RDI->mInfo);
    local_8 = std::
              distance<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,false>*>
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return local_8;
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }